

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyHashForEach(SyHash *pHash,_func_sxi32_SyHashEntry_ptr_void_ptr *xStep,void *pUserData)

{
  SyHashEntry_Pr *pSVar1;
  sxi32 in_EAX;
  sxi32 sVar2;
  uint uVar3;
  SyHashEntry_Pr **ppSVar4;
  
  ppSVar4 = &pHash->pList;
  uVar3 = 0;
  while( true ) {
    if (pHash->nEntry <= uVar3) {
      return in_EAX;
    }
    pSVar1 = *ppSVar4;
    sVar2 = (*xStep)((SyHashEntry *)pSVar1,pUserData);
    if (sVar2 != 0) break;
    ppSVar4 = &pSVar1->pNext;
    uVar3 = uVar3 + 1;
    in_EAX = 0;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyHashForEach(SyHash *pHash, sxi32 (*xStep)(SyHashEntry *, void *), void *pUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
	sxu32 n;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) || xStep == 0){
		return 0;
	}
#endif
	pEntry = pHash->pList;
	for( n = 0 ; n < pHash->nEntry ; n++ ){
		/* Invoke the callback */
		rc = xStep((SyHashEntry *)pEntry, pUserData);
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Point to the next entry */
		pEntry = pEntry->pNext;
	}
	return SXRET_OK;
}